

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O0

char * TEST_add_static_int_array_option(void)

{
  int iVar1;
  ulong local_80;
  size_t k;
  size_t i;
  size_t count;
  char *args [5];
  int a_expect [3];
  int a [3];
  cargo_t cargo;
  char *pcStack_18;
  int ret;
  char *msg;
  
  pcStack_18 = (char *)0x0;
  iVar1 = cargo_init((cargo_t *)(a + 1),0,"program");
  if (iVar1 == 0) {
    args[4] = (char *)0xfffffffe00000001;
    a_expect[0] = 3;
    memcpy(&count,&DAT_0013dd00,0x28);
    i = 0;
    iVar1 = cargo_add_option((cargo_t)a._4_8_,0,"--beta -b","Description",".[i]#",a_expect + 1,&i,3)
    ;
    if (iVar1 == 0) {
      iVar1 = cargo_parse((cargo_t)a._4_8_,0,1,5,(char **)&count);
      if (iVar1 == 0) {
        if (i == 3) {
          printf("Read %lu values from int array:\n",3);
          for (k = 0; k < 3; k = k + 1) {
            printf("  %d\n",(ulong)(uint)a_expect[k + 1]);
          }
          printf("Check that \"a\" has ARRAY_SIZE elements\n");
          if (i == 3) {
            for (local_80 = 0; local_80 < 3; local_80 = local_80 + 1) {
              if (a_expect[local_80 + 1] != a_expect[local_80 - 2]) {
                pcStack_18 = "Array contains unexpected value";
                break;
              }
            }
          }
          else {
            pcStack_18 = "a array count count is not expected ARRAY_SIZE";
          }
        }
        else {
          pcStack_18 = "Array count is invalid";
        }
      }
      else {
        pcStack_18 = "Failed to parse array: a[ARRAY_SIZE]";
      }
    }
    else {
      pcStack_18 = "Failed to add a[ARRAY_SIZE] array option";
    }
    cargo_destroy((cargo_t *)(a + 1));
    msg = pcStack_18;
  }
  else {
    msg = "Failed to init cargo";
  }
  return msg;
}

Assistant:

_TEST_START(TEST_add_static_int_array_option)
{
    int a[3];
    int a_expect[3] = { 1, -2, 3 };
    char *args[] = { "program", "--beta", "1", "-2", "3" };
    _ADD_TEST_FIXED_ARRAY(".[i]#", "%d");
    _TEST_CLEANUP();
}